

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConfigRule * __thiscall
slang::BumpAllocator::emplace<slang::ast::ConfigRule,slang::ast::ConfigRule>
          (BumpAllocator *this,ConfigRule *args)

{
  ConfigRule *pCVar1;
  long lVar2;
  ConfigRule *pCVar3;
  byte bVar4;
  
  bVar4 = 0;
  pCVar1 = (ConfigRule *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigRule *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (ConfigRule *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  pCVar3 = pCVar1;
  for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pCVar3->liblist).
    super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
    ._M_payload._M_value._M_ptr =
         (args->liblist).
         super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
         ._M_payload._M_value._M_ptr;
    args = (ConfigRule *)((long)args + (ulong)bVar4 * -0x10 + 8);
    pCVar3 = (ConfigRule *)((long)pCVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }